

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

int __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::NSideConnects
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,int side)

{
  int iVar1;
  int iVar2;
  long *in_RDI;
  int ncon;
  undefined4 local_4;
  
  iVar1 = pztopology::TPZLine::SideDimension(0x19f6ab0);
  iVar2 = (**(code **)(*in_RDI + 0xb0))();
  if (iVar2 + -2 < iVar1) {
    iVar1 = pztopology::TPZLine::SideDimension(0x19f6ae2);
    iVar2 = (**(code **)(*in_RDI + 0xb0))();
    if (iVar1 == iVar2 + -1) {
      local_4 = 1;
    }
    else {
      iVar1 = pztopology::TPZLine::SideDimension(0x19f6b14);
      iVar2 = (**(code **)(*in_RDI + 0xb0))();
      if (iVar1 == iVar2) {
        local_4 = 1;
      }
      else {
        local_4 = -1;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZCompElHDiv<TSHAPE>::NSideConnects(int side) const{
	if(TSHAPE::SideDimension(side)<= Dimension()-2) return 0;
	if(TSHAPE::SideDimension(side)==Dimension()-1) return 1;
	if(TSHAPE::SideDimension(side)== Dimension()) {
        int ncon = 1;
        return ncon;
    }
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << "Side: " << side <<"unhandled case ";
		LOGPZ_ERROR(logger,sout.str())
	}
#endif
	return -1;

}